

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# color.h
# Opt level: O0

void gimage::imageToColor<float,gimage::PixelTraits<float>>
               (Image<float,_gimage::PixelTraits<float>_> *ret,
               Image<float,_gimage::PixelTraits<float>_> *image)

{
  long lVar1;
  long lVar2;
  long lVar3;
  Image<float,_gimage::PixelTraits<float>_> *in_RSI;
  Image<float,_gimage::PixelTraits<float>_> *in_RDI;
  store_t_conflict sVar4;
  long i;
  long k;
  long in_stack_ffffffffffffffc8;
  Image<float,_gimage::PixelTraits<float>_> *h;
  Image<float,_gimage::PixelTraits<float>_> *in_stack_ffffffffffffffe0;
  undefined8 local_18;
  
  h = in_RDI;
  lVar1 = Image<float,_gimage::PixelTraits<float>_>::getWidth(in_RSI);
  Image<float,_gimage::PixelTraits<float>_>::getHeight(in_RSI);
  Image<float,_gimage::PixelTraits<float>_>::setSize
            (in_stack_ffffffffffffffe0,lVar1,(long)h,in_stack_ffffffffffffffc8);
  local_18 = 0;
  while( true ) {
    lVar1 = local_18;
    lVar2 = Image<float,_gimage::PixelTraits<float>_>::getHeight(in_RSI);
    if (lVar2 <= lVar1) break;
    lVar1 = 0;
    while( true ) {
      lVar2 = lVar1;
      lVar3 = Image<float,_gimage::PixelTraits<float>_>::getWidth(in_RSI);
      if (lVar3 <= lVar1) break;
      lVar1 = lVar2;
      sVar4 = Image<float,_gimage::PixelTraits<float>_>::get(in_RSI,lVar2,local_18,0);
      Image<float,_gimage::PixelTraits<float>_>::set(in_RDI,lVar2,local_18,0,sVar4);
      lVar2 = lVar1;
      sVar4 = Image<float,_gimage::PixelTraits<float>_>::get(in_RSI,lVar1,local_18,0);
      Image<float,_gimage::PixelTraits<float>_>::set(in_RDI,lVar1,local_18,1,sVar4);
      lVar1 = lVar2;
      sVar4 = Image<float,_gimage::PixelTraits<float>_>::get(in_RSI,lVar2,local_18,0);
      Image<float,_gimage::PixelTraits<float>_>::set(in_RDI,lVar2,local_18,2,sVar4);
      lVar1 = lVar1 + 1;
    }
    local_18 = local_18 + 1;
  }
  return;
}

Assistant:

void imageToColor(Image<T, traits> &ret, const Image<T, traits> &image)
{
  assert(image.getDepth() == 1);

  ret.setSize(image.getWidth(), image.getHeight(), 3);

  for (long k=0; k<image.getHeight(); k++)
  {
    for (long i=0; i<image.getWidth(); i++)
    {
      ret.set(i, k, 0, image.get(i, k, 0));
      ret.set(i, k, 1, image.get(i, k, 0));
      ret.set(i, k, 2, image.get(i, k, 0));
    }
  }
}